

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# silent_printf.cpp
# Opt level: O3

int Silent_PAL_vfprintf(PAL_FILE *stream,char *format,__va_list_tag *aparg)

{
  LPCWSTR pWVar1;
  LPCWSTR lpWideCharStr;
  char *pvBuffer;
  byte bVar2;
  BOOL BVar3;
  uint uVar4;
  INT IVar5;
  int iVar6;
  ulong uVar7;
  LPSTR lpMultiByteStr;
  LPSTR pCVar8;
  short *psVar9;
  INT *pIVar10;
  undefined8 *puVar11;
  int *piVar12;
  uint *puVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long in_FS_OFFSET;
  undefined1 auStack_4a8 [8];
  CHAR TempBuffer [4];
  uint local_480;
  int local_47c;
  INT Prefix;
  INT Type;
  char *local_470;
  LPCSTR Fmt;
  int local_460;
  INT Flags;
  INT Width;
  INT Precision;
  va_list ap;
  CHAR local_438 [8];
  CHAR TempBuff [1024];
  
  TempBuff._1016_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  ap[0].overflow_arg_area = aparg->reg_save_area;
  Width = aparg->gp_offset;
  Precision = aparg->fp_offset;
  ap[0]._0_8_ = aparg->overflow_arg_area;
  iVar16 = 0;
  local_470 = format;
LAB_00319eb9:
  do {
    while( true ) {
      if (*local_470 == '%') break;
      if (*local_470 == '\0') goto LAB_0031a462;
LAB_00319f6f:
      pvBuffer = local_470;
      local_470 = local_470 + 1;
      PAL_fwrite(pvBuffer,1,1,stream);
      if (stream->PALferrorCode == 1) goto LAB_0031a45c;
      iVar16 = iVar16 + 1;
    }
    BVar3 = Silent_ExtractFormatA
                      (&local_470,local_438,(LPINT)((long)&Fmt + 4),&local_460,&Flags,
                       (LPINT)&local_480,&local_47c);
    iVar15 = local_47c;
    uVar4 = local_480;
    if (BVar3 == 0) goto LAB_00319f6f;
    if (local_47c != 2 || (local_480 ^ 2) != 0) {
      if ((local_480 ^ 2) == 0 && local_47c == 1) {
        uVar4 = Width;
        if (local_460 + 3U < 2) {
          if ((uint)Width < 0x29) {
            uVar4 = Width + 8;
            _Width = CONCAT44(Precision,uVar4);
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if ((Flags & 0xfffffffdU) == 0xfffffffc) {
          if (uVar4 < 0x29) {
            uVar4 = uVar4 + 8;
            _Width = CONCAT44(Precision,uVar4);
            goto LAB_0031a255;
          }
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
LAB_0031a276:
          puVar13 = (uint *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        else {
LAB_0031a255:
          if (0x28 < uVar4) goto LAB_0031a276;
          _Width = CONCAT44(Precision,uVar4 + 8);
          puVar13 = (uint *)((ulong)uVar4 + (long)ap[0].overflow_arg_area);
        }
        bVar2 = (byte)*puVar13;
        if ((*puVar13 & 0xff00) != 0) {
          bVar2 = 0x3f;
        }
        auStack_4a8[1] = 0;
        auStack_4a8[0] = bVar2;
        IVar5 = Silent_AddPaddingVfprintf(stream,auStack_4a8,local_460 + -1,Fmt._4_4_);
        if (IVar5 == -1) goto LAB_0031a45c;
        iVar16 = iVar16 + IVar5;
      }
      else if (local_47c == 6) {
        if (local_460 == -2) {
          uVar7 = _Width & 0xffffffff;
          if (uVar7 < 0x29) {
            _Width = CONCAT44(Precision,Width + 8);
            pIVar10 = (INT *)(uVar7 + (long)ap[0].overflow_arg_area);
          }
          else {
            pIVar10 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          local_460 = *pIVar10;
        }
        if (Flags == -2) {
          uVar7 = _Width & 0xffffffff;
          if (uVar7 < 0x29) {
            _Width = CONCAT44(Precision,Width + 8);
            pIVar10 = (INT *)(uVar7 + (long)ap[0].overflow_arg_area);
          }
          else {
            pIVar10 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Flags = *pIVar10;
        }
        if (local_480 == 1) {
          uVar7 = _Width & 0xffffffff;
          if (uVar7 < 0x29) {
            _Width = CONCAT44(Precision,Width + 8);
            puVar11 = (undefined8 *)(uVar7 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar11 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          *(short *)*puVar11 = (short)iVar16;
        }
        else {
          uVar7 = _Width & 0xffffffff;
          if (uVar7 < 0x29) {
            _Width = CONCAT44(Precision,Width + 8);
            puVar11 = (undefined8 *)(uVar7 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar11 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          *(int *)*puVar11 = iVar16;
        }
      }
      else {
        if ((local_47c == 5 && (local_480 ^ 1) == 0) || ((local_480 ^ 1) == 0 && local_47c == 4)) {
          uVar7 = _Width & 0xffffffff;
          if (uVar7 < 0x29) {
            _Width = CONCAT44(Precision,Width + 8);
            psVar9 = (short *)(uVar7 + (long)ap[0].overflow_arg_area);
          }
          else {
            psVar9 = (short *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          iVar6 = fprintf((FILE *)stream,local_438,(ulong)(uint)(int)*psVar9);
        }
        else {
          auStack_4a8 = (undefined1  [8])_Width;
          _TempBuffer = (void *)ap[0]._0_8_;
          iVar6 = PAL_vfprintf(stream,local_438,(__va_list_tag *)auStack_4a8);
          PAL_printf_arg_remover((va_list *)&Width,local_460,Flags,iVar15,uVar4);
        }
        if (iVar6 == -1) {
          iVar6 = 0;
        }
        iVar16 = iVar16 + iVar6;
      }
      goto LAB_00319eb9;
    }
    if (local_460 == -3) {
      if ((uint)Width < 0x29) {
        _Width = CONCAT44(Precision,Width + 8);
      }
      else {
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      IVar5 = -3;
    }
    else {
      IVar5 = local_460;
      if (local_460 == -2) {
        uVar7 = _Width & 0xffffffff;
        if (uVar7 < 0x29) {
          _Width = CONCAT44(Precision,Width + 8);
          pIVar10 = (INT *)(uVar7 + (long)ap[0].overflow_arg_area);
        }
        else {
          pIVar10 = (INT *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        IVar5 = *pIVar10;
        local_460 = IVar5;
      }
    }
    uVar7 = _Width & 0xffffffff;
    if (Flags == -4) {
      if ((uint)Width < 0x29) {
        uVar7 = (ulong)(Width + 8U);
        _Width = CONCAT44(Precision,Width + 8U);
        iVar15 = -4;
        goto LAB_0031a103;
      }
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
      iVar15 = -4;
LAB_0031a12a:
      puVar11 = (undefined8 *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    else {
      iVar15 = Flags;
      if (Flags == -2) {
        if ((uint)Width < 0x29) {
          piVar12 = (int *)((long)ap[0].overflow_arg_area + uVar7);
          uVar7 = (ulong)(Width + 8U);
          _Width = CONCAT44(Precision,Width + 8U);
        }
        else {
          piVar12 = (int *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        iVar15 = *piVar12;
        Flags = iVar15;
      }
LAB_0031a103:
      if (0x28 < (uint)uVar7) goto LAB_0031a12a;
      _Width = CONCAT44(Precision,(uint)uVar7 + 8);
      puVar11 = (undefined8 *)(uVar7 + (long)ap[0].overflow_arg_area);
    }
    lpWideCharStr = (LPCWSTR)*puVar11;
    if (lpWideCharStr == (LPCWSTR)0x0) goto LAB_0031a45c;
    Prefix = IVar5;
    if (*lpWideCharStr == L'\0') {
      lVar14 = 1;
    }
    else {
      lVar14 = 1;
      do {
        pWVar1 = lpWideCharStr + lVar14;
        lVar14 = lVar14 + 1;
      } while (*pWVar1 != L'\0');
      if ((int)lVar14 == 0) goto LAB_0031a45c;
    }
    iVar6 = (int)lVar14;
    lpMultiByteStr = (LPSTR)PAL_malloc((long)iVar6);
    if (lpMultiByteStr == (LPSTR)0x0) goto LAB_0031a45c;
    pCVar8 = lpMultiByteStr;
    iVar17 = 0;
    Type = iVar16;
    if (iVar15 == -3) {
LAB_0031a1ca:
      *pCVar8 = '\0';
    }
    else {
      iVar17 = iVar6 + -1;
      if ((0 < iVar15) && (iVar15 < iVar17)) {
        iVar16 = Silent_WideCharToMultiByte(lpWideCharStr,iVar15,lpMultiByteStr,iVar6);
        if (iVar16 != 0) {
          pCVar8 = lpMultiByteStr + iVar16;
          iVar17 = iVar15;
          goto LAB_0031a1ca;
        }
LAB_0031a454:
        PAL_free(lpMultiByteStr);
LAB_0031a45c:
        iVar16 = -1;
LAB_0031a462:
        if (*(long *)(in_FS_OFFSET + 0x28) != TempBuff._1016_8_) {
          __stack_chk_fail();
        }
        return iVar16;
      }
      iVar16 = Silent_WideCharToMultiByte(lpWideCharStr,-1,lpMultiByteStr,iVar6);
      if (iVar16 == 0) goto LAB_0031a454;
    }
    IVar5 = Silent_AddPaddingVfprintf(stream,lpMultiByteStr,Prefix - iVar17,Fmt._4_4_);
    if (IVar5 == -1) goto LAB_0031a454;
    iVar16 = Type + IVar5;
    PAL_free(lpMultiByteStr);
  } while( true );
}

Assistant:

int Silent_PAL_vfprintf(PAL_FILE *stream, const char *format, va_list aparg)
{
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    LPCSTR Fmt = format;
    LPWSTR TempWStr;
    LPSTR TempStr;
    WCHAR TempWChar;
    INT Flags;
    INT Width;
    INT Precision;
    INT Prefix;
    INT Type;
    INT Length;
    INT TempInt;
    int wctombResult;
    int written = 0;
    int paddingReturnValue;
    va_list ap;
    
    va_copy(ap, aparg);

    while (*Fmt)
    {
        if (*Fmt == '%' &&
            TRUE == Silent_ExtractFormatA(&Fmt, TempBuff, &Flags, &Width, 
                                          &Precision, &Prefix, &Type))
        {
            if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_STRING)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                else if (WIDTH_INVALID == Width)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }
                else if (PRECISION_INVALID == Precision)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWStr = va_arg(ap, LPWSTR);
                Length = Silent_WideCharToMultiByte(TempWStr, -1, 0, 0);
                if (!Length)
                {
                    va_end(ap);
                    return -1;
                }
                TempStr = (LPSTR) PAL_malloc(Length);
                if (!TempStr)
                {
                    va_end(ap);
                    return -1;
                }
                if (PRECISION_DOT == Precision)
                {
                    /* copy nothing */
                    *TempStr = 0;
                    Length = 0;
                }
                else if (Precision > 0 && Precision < Length - 1)
                {
                    Length = Silent_WideCharToMultiByte(TempWStr, Precision, 
                                                        TempStr, Length);
                    if (!Length)
                    {
                        PAL_free(TempStr);
                        va_end(ap);
                        return -1;
                    }
                    TempStr[Length] = 0;
                    Length = Precision;
                }
                /* copy everything */
                else
                {
                    wctombResult = Silent_WideCharToMultiByte(TempWStr, -1, 
                                                              TempStr, Length);
                    if (!wctombResult)
                    {
                        PAL_free(TempStr);
                        va_end(ap);
                        return -1;
                    }
                    --Length; /* exclude null char */
                }

                /* do the padding (if needed)*/
                paddingReturnValue =
                  Silent_AddPaddingVfprintf(stream, TempStr, Width - Length, Flags);
                if (-1 == paddingReturnValue)
                {
                    PAL_free(TempStr);
                    va_end(ap);
                    return -1;
                }
                written += paddingReturnValue;

                PAL_free(TempStr);
            }
            else if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_CHAR)
            {
                CHAR TempBuffer[4];
                if (WIDTH_STAR == Width ||
                    WIDTH_INVALID == Width)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }
                if (PRECISION_STAR == Precision ||
                    PRECISION_INVALID == Precision)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWChar = va_arg(ap, int);
                Length = Silent_WideCharToMultiByte(&TempWChar, 1, TempBuffer, 4);
                if (!Length)
                {
                    va_end(ap);
                    return -1;
                }
                TempBuffer[Length] = 0;

                /* do the padding (if needed)*/
                paddingReturnValue =
                  Silent_AddPaddingVfprintf(stream, TempBuffer,
                                              Width - Length, Flags);
                if (-1 == paddingReturnValue)
                {
                    va_end(ap);
                    return -1;
                }
                written += paddingReturnValue;

            }
            /* this places the number of bytes written to the buffer in the
               next arg */
            else if (Type == PFF_TYPE_N)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }

                if (Prefix == PFF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = written;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = written;
                }
            }
            /* types that sprintf can handle */
            else
            {
                TempInt = 0;

                /* %h (short) doesn't seem to be handled properly by local sprintf,
                   so lets do the truncation ourselves.  (ptr -> int -> short to avoid
                   warnings */
                if (Type == PFF_TYPE_P && Prefix == PFF_PREFIX_SHORT)
                {
                    long trunc1;
                    short trunc2;

                    trunc1 = va_arg(ap, LONG);
                    trunc2 = (short)trunc1;

                    TempInt = fprintf((FILE*)stream, TempBuff, trunc2);
                }
                else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert explicitly from int to short to get
                    // correct sign extension for shorts on all systems.
                    int n;
                    short s;

                    n = va_arg(ap, int);
                    s = (short)n;

                    TempInt = fprintf((FILE*)stream, TempBuff, s);
                }
                else
                {
                    va_list apcopy;
                    va_copy(apcopy, ap);
                    TempInt = PAL_vfprintf(stream, TempBuff, apcopy);
                    va_end(apcopy);
                    PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);
                }

                if (-1 != TempInt)
                {
                    written += TempInt;
                }
            }
        }
        else
        {
#if FILE_OPS_CHECK_FERROR_OF_PREVIOUS_CALL
            clearerr((FILE*)stream);
#endif

            PAL_fwrite(Fmt++, 1, 1, stream); /* copy regular chars into buffer */
            if (stream->PALferrorCode == PAL_FILE_ERROR)
            {
                va_end(ap);
                return -1;
            }
            ++written;
        }
    }

    va_end(ap);
    return written;
}